

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O1

optional<unsigned_long> __thiscall
gmlc::containers::
DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>::
insert<std::basic_string_view<char,std::char_traits<char>>>
          (DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
           *this,string_view searchValue1,GlobalBrokerId *searchValue2,
          basic_string_view<char,_std::char_traits<char>_> *data)

{
  _Storage<unsigned_long,_true> _Var1;
  iterator iVar2;
  _Storage<unsigned_long,_true> *p_Var3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  long lVar5;
  optional<unsigned_long> oVar6;
  size_type index;
  _Storage<unsigned_long,_true> local_38;
  key_type local_30;
  
  local_30._M_str = searchValue1._M_str;
  local_30._M_len = searchValue1._M_len;
  iVar2 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(this + 0x18),&local_30);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
      ._M_cur != (__node_type *)0x0) {
    local_38 = (_Storage<unsigned_long,_true>)
               CLI::std::
               _Hashtable<helics::GlobalBrokerId,_std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalBrokerId>,_std::hash<helics::GlobalBrokerId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         ((_Hashtable<helics::GlobalBrokerId,_std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalBrokerId>,_std::hash<helics::GlobalBrokerId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)(this + 0x80),(ulong)(long)searchValue2->gid % *(ulong *)(this + 0x88),
                          searchValue2,(long)searchValue2->gid);
    if (((__node_base_ptr)local_38._M_value != (__node_base_ptr)0x0) &&
       (*(_Hash_node_base **)local_38 != (_Hash_node_base *)0x0)) {
      uVar4 = 0;
      goto LAB_00308d45;
    }
  }
  local_38._M_value = (*(long *)(this + 8) - *(long *)this >> 3) * 0x2e8ba2e8ba2e8ba3;
  std::vector<helics::BasicBrokerInfo,std::allocator<helics::BasicBrokerInfo>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>>
            ((vector<helics::BasicBrokerInfo,std::allocator<helics::BasicBrokerInfo>> *)this,data);
  StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            ((StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>> *)
             (this + 0x50),&local_30);
  if ((long)*(int *)(this + 0x68) == 0) {
    lVar5 = *(long *)(*(long *)(this + 0x58) + -8 + (*(ulong *)(this + 0x50) >> 5) * 8) + 0x3e0;
  }
  else {
    lVar5 = *(long *)(*(long *)(this + 0x58) + (long)*(int *)(this + 100) * 8) +
            (long)*(int *)(this + 0x68) * 0x20 + -0x20;
  }
  std::
  _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string&,unsigned_long&>
            ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)(this + 0x18),lVar5,&local_38);
  _Var1 = local_38;
  p_Var3 = (_Storage<unsigned_long,_true> *)
           CLI::std::__detail::
           _Map_base<helics::GlobalBrokerId,_std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalBrokerId>,_std::hash<helics::GlobalBrokerId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<helics::GlobalBrokerId,_std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalBrokerId>,_std::hash<helics::GlobalBrokerId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)(this + 0x80),searchValue2);
  p_Var3->_M_value = (unsigned_long)_Var1;
  uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_00308d45:
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar4;
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_38._M_value;
  return (optional<unsigned_long>)
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(
            std::string_view searchValue1,
            const searchType2& searchValue2,
            Us&&... data)
        {
            auto fnd = lookup1.find(searchValue1);
            if (fnd != lookup1.end()) {
                auto fnd2 = lookup2.find(searchValue2);
                if (fnd2 != lookup2.end()) {
                    return std::nullopt;
                }
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(std::forward<Us>(data)...);
            names.emplace_back(searchValue1);
            lookup1.emplace(names.back(), index);
            lookup2[searchValue2] = index;
            return index;
        }